

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-util-ossl.cpp
# Opt level: O0

eddsa_key_material_t * crypto_malloc_eddsa(EVP_PKEY *pkey)

{
  int iVar1;
  ASN1_OBJECT *pAVar2;
  void *pvVar3;
  EVP_PKEY *in_RDI;
  uchar *p;
  int nid;
  eddsa_key_material_t *keyMat;
  uchar *buf;
  int len;
  int result;
  uchar *local_38;
  int local_2c;
  eddsa_key_material_t *local_28;
  uchar *local_20;
  int local_18;
  int local_14;
  EVP_PKEY *local_10;
  
  if (in_RDI == (EVP_PKEY *)0x0) {
    return (eddsa_key_material_t *)0x0;
  }
  local_10 = in_RDI;
  local_28 = (eddsa_key_material_t *)calloc(1,0x30);
  if (local_28 == (eddsa_key_material_t *)0x0) {
    return (eddsa_key_material_t *)0x0;
  }
  local_2c = EVP_PKEY_get_id(local_10);
  pAVar2 = OBJ_nid2obj(local_2c);
  iVar1 = i2d_ASN1_OBJECT(pAVar2,(uchar **)0x0);
  *(long *)local_28 = (long)iVar1;
  pvVar3 = malloc(*(size_t *)local_28);
  *(void **)(local_28 + 0x18) = pvVar3;
  if (local_2c != 0x40a) {
    if (local_2c == 0x40b) {
      *(size_t *)(local_28 + 8) = 0x38;
      *(size_t *)(local_28 + 0x10) = 0x38;
      goto LAB_0011b114;
    }
    if (local_2c != 0x43f) {
      if (local_2c != 0x440) {
        crypto_free_eddsa((eddsa_key_material_t *)0x11b106);
        return (eddsa_key_material_t *)0x0;
      }
      *(size_t *)(local_28 + 8) = 0x39;
      *(size_t *)(local_28 + 0x10) = 0x39;
      goto LAB_0011b114;
    }
  }
  *(size_t *)(local_28 + 8) = 0x20;
  *(size_t *)(local_28 + 0x10) = 0x20;
LAB_0011b114:
  pvVar3 = malloc(*(size_t *)(local_28 + 8));
  *(void **)(local_28 + 0x20) = pvVar3;
  pvVar3 = malloc(*(size_t *)(local_28 + 0x10));
  *(void **)(local_28 + 0x28) = pvVar3;
  if (((*(size_t *)(local_28 + 0x18) == 0) || (*(size_t *)(local_28 + 0x20) == 0)) ||
     (*(size_t *)(local_28 + 0x28) == 0)) {
    crypto_free_eddsa((eddsa_key_material_t *)0x11b176);
  }
  else {
    local_38 = *(uchar **)(local_28 + 0x18);
    pAVar2 = OBJ_nid2obj(local_2c);
    local_14 = i2d_ASN1_OBJECT(pAVar2,&local_38);
    if (local_14 < 1) {
      crypto_free_eddsa((eddsa_key_material_t *)0x11b1bd);
    }
    else {
      local_18 = i2d_PUBKEY(local_10,(uchar **)0x0);
      if (((long)local_18 == *(size_t *)(local_28 + 0x10) + 0xc) &&
         (local_20 = (uchar *)malloc((long)local_18), local_20 != (uchar *)0x0)) {
        local_38 = local_20;
        i2d_PUBKEY(local_10,&local_38);
        memcpy(*(void **)(local_28 + 0x28),local_20 + 0xc,*(size_t *)(local_28 + 0x10));
        free(local_20);
        local_18 = i2d_PrivateKey(local_10,(uchar **)0x0);
        if (((long)local_18 == *(size_t *)(local_28 + 8) + 0x10) &&
           (local_20 = (uchar *)malloc((long)local_18), local_20 != (uchar *)0x0)) {
          local_38 = local_20;
          i2d_PrivateKey(local_10,&local_38);
          memcpy(*(void **)(local_28 + 0x20),local_20 + 0x10,*(size_t *)(local_28 + 8));
          free(local_20);
          return local_28;
        }
        crypto_free_eddsa((eddsa_key_material_t *)0x11b2ac);
        return (eddsa_key_material_t *)0x0;
      }
      crypto_free_eddsa((eddsa_key_material_t *)0x11b213);
    }
  }
  return (eddsa_key_material_t *)0x0;
}

Assistant:

eddsa_key_material_t* crypto_malloc_eddsa(EVP_PKEY* pkey)
{
	int result;
	int len;
	unsigned char *buf;

	if (pkey == NULL)
	{
		return NULL;
	}

	eddsa_key_material_t* keyMat = (eddsa_key_material_t*)calloc(1, sizeof(eddsa_key_material_t));
	if (keyMat == NULL)
	{
		return NULL;
	}

	int nid = EVP_PKEY_id(pkey);
	keyMat->sizeOID = i2d_ASN1_OBJECT(OBJ_nid2obj(nid), NULL);
	keyMat->derOID = (CK_VOID_PTR)malloc(keyMat->sizeOID);

	switch (nid) {
	case NID_X25519:
	case NID_ED25519:
		keyMat->sizeK = X25519_KEYLEN;
		keyMat->sizeA = X25519_KEYLEN;
		break;
	case NID_X448:
		keyMat->sizeK = X448_KEYLEN;
		keyMat->sizeA = X448_KEYLEN;
		break;
	case NID_ED448:
		keyMat->sizeK = ED448_KEYLEN;
		keyMat->sizeA = ED448_KEYLEN;
		break;
	default:
		crypto_free_eddsa(keyMat);
		return NULL;
	}
	keyMat->bigK = (CK_VOID_PTR)malloc(keyMat->sizeK);
	keyMat->bigA = (CK_VOID_PTR)malloc(keyMat->sizeA);
	if (!keyMat->derOID || !keyMat->bigK || !keyMat->bigA)
	{
		crypto_free_eddsa(keyMat);
		return NULL;
	}

	unsigned char *p = (unsigned char*) keyMat->derOID;
	result = i2d_ASN1_OBJECT(OBJ_nid2obj(nid), &p);
	if (result <= 0)
	{
		crypto_free_eddsa(keyMat);
		return NULL;
	}

	len = i2d_PUBKEY(pkey, NULL);
	if (((CK_ULONG) len != PUBPREFIXLEN + keyMat->sizeA) ||
	    ((buf = (unsigned char*) malloc(len)) == NULL))
	{
		crypto_free_eddsa(keyMat);
		return NULL;
	}
	p = buf;
	i2d_PUBKEY(pkey, &p);
	memcpy(keyMat->bigA, buf + PUBPREFIXLEN, keyMat->sizeA);
	free(buf);

	len = i2d_PrivateKey(pkey, NULL);
	if (((CK_ULONG) len != PRIVPREFIXLEN + keyMat->sizeK) ||
	    ((buf = (unsigned char*) malloc(len)) == NULL))
	{
		crypto_free_eddsa(keyMat);
		return NULL;
	}
	p = buf;
	i2d_PrivateKey(pkey, &p);
	memcpy(keyMat->bigK, buf + PRIVPREFIXLEN, keyMat->sizeK);
	free(buf);

	return keyMat;
}